

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawElementsBaseVertexTests.cpp
# Opt level: O2

void __thiscall
glcts::DrawElementsBaseVertexTestBase::DrawElementsBaseVertexTestBase
          (DrawElementsBaseVertexTestBase *this,Context *context,ExtParameters *extParams,char *name
          ,char *description)

{
  TestCaseBase::TestCaseBase(&this->super_TestCaseBase,context,extParams,name,description);
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DrawElementsBaseVertexTestBase_01df5390;
  this->m_is_vertex_attrib_binding_supported = false;
  this->m_is_draw_elements_base_vertex_supported = false;
  this->m_is_ext_multi_draw_arrays_supported = false;
  this->m_is_geometry_shader_supported = false;
  this->m_is_tessellation_shader_supported = false;
  this->m_gs_id = 0;
  this->m_po_id = 0;
  this->m_bo_id = 0;
  this->m_bo_id_2 = 0;
  this->m_fbo_id = 0;
  this->m_fs_id = 0;
  this->m_po_color_attribute_location = -1;
  this->m_po_uses_gs_stage = false;
  this->m_po_uses_tc_te_stages = false;
  this->m_po_uses_vertex_attrib_binding = false;
  this->m_po_vertex_attribute_location = -1;
  this->m_tc_id = 0;
  this->m_te_id = 0;
  this->m_to_base_id = 0;
  this->m_to_ref_id = 0;
  this->m_vao_id = 0;
  this->m_vs_id = 0;
  this->m_draw_call_color_offset = (GLfloat *)0x0;
  this->m_draw_call_index_offset = (GLuint *)0x0;
  this->m_draw_call_index2_offset = (GLuint *)0x0;
  this->m_draw_call_index3_offset = (GLubyte *)0x0;
  this->m_draw_call_index4_offset = (GLushort *)0x0;
  this->m_draw_call_index5_offset = (GLuint *)0x0;
  this->m_draw_call_vertex_offset = (GLfloat *)0x0;
  this->m_draw_call_vertex2_offset = (GLfloat *)0x0;
  (this->m_test_cases).
  super__Vector_base<glcts::DrawElementsBaseVertexTestBase::_test_case,_std::allocator<glcts::DrawElementsBaseVertexTestBase::_test_case>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<glcts::DrawElementsBaseVertexTestBase::_test_case,_std::allocator<glcts::DrawElementsBaseVertexTestBase::_test_case>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<glcts::DrawElementsBaseVertexTestBase::_test_case,_std::allocator<glcts::DrawElementsBaseVertexTestBase::_test_case>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_to_height = 0x80;
  this->m_to_width = 0x80;
  this->m_to_base_data = (uchar *)0x0;
  this->m_to_ref_data = (uchar *)0x0;
  this->m_bo_functional_data_color = DrawElementsBaseVertexTestBase::functional_color_data;
  this->m_bo_functional_data_color_size = 0x108;
  this->m_bo_functional_data_index = DrawElementsBaseVertexTestBase::functional_index_data;
  this->m_bo_functional_data_index_size = 0x5c;
  this->m_bo_functional_data_vertex = DrawElementsBaseVertexTestBase::functional_vertex_data;
  this->m_bo_functional_data_vertex_size = 0x108;
  this->m_bo_functional2_data_index = DrawElementsBaseVertexTestBase::functional2_index_data;
  this->m_bo_functional2_data_index_size = 0xa0;
  this->m_bo_functional3_data_index = "";
  this->m_bo_functional3_data_index_size = 0xc;
  this->m_bo_functional4_data_index = DrawElementsBaseVertexTestBase::functional4_index_data;
  this->m_bo_functional4_data_index_size = 0x18;
  this->m_bo_functional5_data_index = DrawElementsBaseVertexTestBase::functional5_index_data;
  this->m_bo_functional5_data_index_size = 0xc0;
  this->m_bo_functional2_data_vertex = DrawElementsBaseVertexTestBase::functional2_vertex_data;
  this->m_bo_functional2_data_vertex_size = 0xb8;
  this->m_bo_negative_data_index = DrawElementsBaseVertexTestBase::negative_index_data;
  this->m_bo_negative_data_index_size = 0xc;
  this->m_bo_negative_data_vertex = DrawElementsBaseVertexTestBase::negative_vertex_data;
  this->m_bo_negative_data_vertex_size = 0x18;
  return;
}

Assistant:

DrawElementsBaseVertexTestBase::DrawElementsBaseVertexTestBase(glcts::Context& context, const ExtParameters& extParams,
															   const char* name, const char* description)
	: TestCaseBase(context, extParams, name, description)
	, m_is_draw_elements_base_vertex_supported(false)
	, m_is_ext_multi_draw_arrays_supported(false)
	, m_is_geometry_shader_supported(false)
	, m_is_tessellation_shader_supported(false)
	, m_is_vertex_attrib_binding_supported(false)
	, m_bo_id(0)
	, m_bo_id_2(0)
	, m_fbo_id(0)
	, m_fs_id(0)
	, m_gs_id(0)
	, m_po_id(0)
	, m_po_color_attribute_location(-1)
	, m_po_uses_gs_stage(false)
	, m_po_uses_tc_te_stages(false)
	, m_po_uses_vertex_attrib_binding(false)
	, m_po_vertex_attribute_location(-1)
	, m_tc_id(0)
	, m_te_id(0)
	, m_to_base_id(0)
	, m_to_ref_id(0)
	, m_vao_id(0)
	, m_vs_id(0)
	, m_bo_negative_data_index_size(-1)
	, m_bo_negative_data_vertex_size(-1)
	, m_draw_call_color_offset(DE_NULL)
	, m_draw_call_index_offset(DE_NULL)
	, m_draw_call_index2_offset(DE_NULL)
	, m_draw_call_index3_offset(DE_NULL)
	, m_draw_call_index4_offset(DE_NULL)
	, m_draw_call_index5_offset(DE_NULL)
	, m_draw_call_vertex_offset(DE_NULL)
	, m_draw_call_vertex2_offset(DE_NULL)
	, m_to_height(128)
	, m_to_width(128)
	, m_to_base_data(DE_NULL)
	, m_to_ref_data(DE_NULL)
{
	static const glw::GLuint functional_index_data[] = /* used for a number of Functional Tests */
		{ 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16, 17, 18, 19, 20, 21, 22 };
	static const glw::GLuint functional2_index_data[] = /* used for Functional Test IV */
		{ 10, 11, 12, 13, 14, 15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25, 26, 27, 28, 29,
		  30, 31, 32, 0,  1,  2,  3,  4,  5,  6,  7,  8,  9,  10, 11, 12, 13, 14, 15, 16 };
	static const glw::GLubyte functional3_index_data[] = /* used for Functional Test IX */
		{ 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11 };
	static const glw::GLushort functional4_index_data[] = /* used for Functional Test IX */
		{ 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11 };
	static const glw::GLuint functional5_index_data[] = /* used for Functional Test IX */
		{ 2147483647 + 3u,								/* 2^31 + 2 */
		  2147483647 + 4u,
		  2147483647 + 5u,
		  2147483647 + 6u,
		  2147483647 + 7u,
		  2147483647 + 8u,
		  2147483647 + 9u,
		  2147483647 + 10u,
		  2147483647 + 11u,
		  2147483647 + 12u,
		  2147483647 + 13u,
		  2147483647 + 14u,
		  257, // regular draw call indices for ubyte ref image
		  258,
		  259,
		  260,
		  261,
		  262,
		  263,
		  264,
		  265,
		  266,
		  267,
		  268,
		  65537, // regular draw call indices for ushort ref image
		  65538,
		  65539,
		  65540,
		  65541,
		  65542,
		  65543,
		  65544,
		  65545,
		  65546,
		  65547,
		  65548,
		  0, // regular draw call indices for uint ref image
		  1,
		  2,
		  3,
		  4,
		  5,
		  6,
		  7,
		  8,
		  9,
		  10,
		  11 };
	static const glw::GLfloat functional_color_data[] = /* used for "vertex attrib binding" Functional Test */
		{
		  0.1f, 0.2f, 0.2f, 0.3f, 0.3f, 0.4f, 0.4f, 0.5f, 0.5f, 0.6f, 0.6f, 0.7f, 0.7f, 0.8f, 0.8f, 0.9f, 0.9f,
		  1.0f, 1.0f, 0.9f, 0.9f, 0.8f, 0.8f, 0.7f, 0.7f, 0.6f, 0.6f, 0.5f, 0.5f, 0.4f, 0.4f, 0.3f, 0.3f, 0.2f,
		  0.2f, 0.1f, 0.1f, 0.0f, 0.0f, 0.1f, 0.1f, 0.2f, 0.2f, 0.4f, 0.3f, 0.9f, 0.4f, 0.8f, 0.5f, 1.0f, 0.6f,
		  0.8f, 0.7f, 0.1f, 0.8f, 0.3f, 0.9f, 0.5f, 1.0f, 0.0f, 0.2f, 0.0f, 0.0f, 0.3f, 0.1f, 1.0f,
		};
	static const glw::GLfloat functional_vertex_data[] = /* used by a number of Functional Tests */
		{
		  0.0f,  0.0f,  -0.1f, -0.1f, 0.2f,  0.8f,  -0.3f, -0.3f, 0.4f,  -0.4f, 0.5f,  0.5f, -0.6f, 0.6f,
		  0.7f,  -0.7f, -0.8f, 0.8f,  0.9f,  -0.9f, -1.0f, -1.0f, 1.0f,  -1.0f, 0.0f,  1.0f, -0.9f, 0.1f,
		  0.8f,  -0.2f, -0.7f, 0.3f,  -0.6f, -0.4f, 0.5f,  -0.5f, -0.4f, -0.6f, 0.3f,  0.7f, -0.2f, -0.8f,
		  -0.1f, -0.9f, 0.0f,  0.0f,  0.5f,  0.5f,  -0.6f, 0.6f,  0.7f,  -0.7f, -0.8f, 0.8f, 0.9f,  -0.9f,
		  -1.0f, -1.0f, 1.0f,  -1.0f, 0.0f,  1.0f,  -0.9f, 0.1f,  0.8f,  -0.2f,
		};
	static const glw::GLfloat functional2_vertex_data[] = /* used by a number of Functional Tests */
		{
		  -1.0f, -1.0f, 1.0f, -1.0f, 0.0f, 1.0f, 0.3f, 0.3f, 0.4f, 0.4f, 0.5f, 0.5f, 0.6f, 0.6f, 0.7f, 0.7f,
		  0.8f,  0.8f,  0.9f, 0.9f,  0.1f, 0.2f, 0.2f, 0.1f, 0.1f, 0.2f, 0.9f, 0.1f, 0.8f, 0.2f, 0.7f, 0.3f,
		  0.6f,  0.4f,  0.5f, 0.5f,  0.4f, 0.6f, 0.3f, 0.7f, 0.2f, 0.8f, 0.1f, 0.9f, 0.0f, 0.0f,

		};
	static const glw::GLuint negative_index_data[]  = { 0, 1, 2 };
	static const float		 negative_vertex_data[] = { -1.0f, -1.0f, 1.0f, -1.0f, 0.0f, 1.0f };

	m_bo_functional_data_color		  = functional_color_data;
	m_bo_functional_data_color_size   = sizeof(functional_color_data);
	m_bo_functional_data_index		  = functional_index_data;
	m_bo_functional_data_index_size   = sizeof(functional_index_data);
	m_bo_functional_data_vertex		  = functional_vertex_data;
	m_bo_functional_data_vertex_size  = sizeof(functional_vertex_data);
	m_bo_functional2_data_index		  = functional2_index_data;
	m_bo_functional2_data_index_size  = sizeof(functional2_index_data);
	m_bo_functional3_data_index		  = functional3_index_data;
	m_bo_functional3_data_index_size  = sizeof(functional3_index_data);
	m_bo_functional4_data_index		  = functional4_index_data;
	m_bo_functional4_data_index_size  = sizeof(functional4_index_data);
	m_bo_functional5_data_index		  = functional5_index_data;
	m_bo_functional5_data_index_size  = sizeof(functional5_index_data);
	m_bo_functional2_data_vertex	  = functional2_vertex_data;
	m_bo_functional2_data_vertex_size = sizeof(functional2_vertex_data);
	m_bo_negative_data_index		  = negative_index_data;
	m_bo_negative_data_index_size	 = sizeof(negative_index_data);
	m_bo_negative_data_vertex		  = negative_vertex_data;
	m_bo_negative_data_vertex_size	= sizeof(negative_vertex_data);
}